

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenOperatorNewDelete(CppGenerator *this,StructDef *struct_def)

{
  Value *pVVar1;
  CodeWriter *this_00;
  allocator<char> local_f9;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"native_custom_alloc",&local_f9);
  pVVar1 = SymbolTable<flatbuffers::Value>::Lookup
                     (&(struct_def->super_Definition).attributes,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  if (pVVar1 != (Value *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"  inline void *operator new (std::size_t count) {",
               (allocator<char> *)&local_f8);
    this_00 = &this->code_;
    CodeWriter::operator+=(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::operator+(&local_f8,"    return ",&pVVar1->constant);
    std::operator+(&local_58,&local_f8,
                   "<{{NATIVE_NAME}}>().allocate(count / sizeof({{NATIVE_NAME}}));");
    CodeWriter::operator+=(this_00,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"  }",(allocator<char> *)&local_f8);
    CodeWriter::operator+=(this_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"  inline void operator delete (void *ptr) {",
               (allocator<char> *)&local_f8);
    CodeWriter::operator+=(this_00,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+(&local_f8,"    return ",&pVVar1->constant);
    std::operator+(&local_b8,&local_f8,
                   "<{{NATIVE_NAME}}>().deallocate(static_cast<{{NATIVE_NAME}}*>(ptr),1);");
    CodeWriter::operator+=(this_00,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"  }",(allocator<char> *)&local_f8);
    CodeWriter::operator+=(this_00,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  return;
}

Assistant:

void GenOperatorNewDelete(const StructDef &struct_def) {
    if (auto native_custom_alloc =
            struct_def.attributes.Lookup("native_custom_alloc")) {
      code_ += "  inline void *operator new (std::size_t count) {";
      code_ += "    return " + native_custom_alloc->constant +
               "<{{NATIVE_NAME}}>().allocate(count / sizeof({{NATIVE_NAME}}));";
      code_ += "  }";
      code_ += "  inline void operator delete (void *ptr) {";
      code_ += "    return " + native_custom_alloc->constant +
               "<{{NATIVE_NAME}}>().deallocate(static_cast<{{NATIVE_NAME}}*>("
               "ptr),1);";
      code_ += "  }";
    }
  }